

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::ChArchiveIn::in<chrono::ChVector<double>*>
          (ChArchiveIn *this,
          ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
          *bVal)

{
  vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> *pvVar1;
  pointer ppCVar2;
  ulong uVar3;
  ChVector<double> *element;
  size_t arraysize;
  ChFunctorArchiveInSpecificPtr<chrono::ChVector<double>_> specFuncA;
  char idname [20];
  ChVector<double> *local_80;
  size_type local_78;
  undefined **local_70;
  ChVector<double> **local_68;
  char *local_60;
  undefined ***local_58;
  undefined1 local_50;
  char local_48 [24];
  
  pvVar1 = bVal->_value;
  ppCVar2 = (pvVar1->
            super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar1->
      super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppCVar2) {
    (pvVar1->
    super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppCVar2;
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])(this,bVal->_name,&local_78);
  std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::resize
            (bVal->_value,local_78);
  if (local_78 != 0) {
    uVar3 = 0;
    do {
      sprintf(local_48,"%lu",uVar3);
      local_70 = &PTR__ChFunctorArchiveIn_0015a930;
      local_68 = &local_80;
      local_50 = 0;
      local_60 = local_48;
      local_58 = &local_70;
      (*(this->super_ChArchive)._vptr_ChArchive[0xd])(this,&local_60);
      (bVal->_value->
      super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>).
      _M_impl.super__Vector_impl_data._M_start[uVar3] = local_80;
      (*(this->super_ChArchive)._vptr_ChArchive[0xf])(this,bVal->_name);
      uVar3 = uVar3 + 1;
    } while (uVar3 < local_78);
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::vector<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          bVal.value().resize(arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }